

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

ssize_t __thiscall JSON::JSON_string::write(JSON_string *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  undefined8 uVar6;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string local_78;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  string local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\"","");
  Writer::encode_string(&local_78,&this->utf8);
  uVar5 = 0xf;
  if (local_58 != local_48) {
    uVar5 = local_48[0];
  }
  if (uVar5 < local_78._M_string_length + local_50) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar6 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_50 <= (ulong)uVar6) {
      puVar1 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
      goto LAB_00121449;
    }
  }
  puVar1 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
LAB_00121449:
  local_98 = &local_88;
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_88 = *plVar2;
    uStack_80 = puVar1[3];
  }
  else {
    local_88 = *plVar2;
    local_98 = (long *)*puVar1;
  }
  local_90 = puVar1[1];
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_38.field_2._M_allocated_capacity = *psVar4;
    local_38.field_2._8_8_ = plVar2[3];
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = *psVar4;
    local_38._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_38._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Pipeline::operator<<((Pipeline *)CONCAT44(in_register_00000034,__fd),&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  paVar3 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    paVar3 = extraout_RAX;
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
    paVar3 = extraout_RAX_00;
  }
  return (ssize_t)paVar3;
}

Assistant:

void
JSON::JSON_string::write(Pipeline* p, size_t) const
{
    *p << std::string("\"") + Writer::encode_string(utf8) + "\"";
}